

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O2

void __thiscall
BCLog::Logger::LogPrintStr_
          (Logger *this,string_view str,string_view logging_function,string_view source_file,
          int source_line,LogFlags category,Level level)

{
  list<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_> *this_00;
  __int_type_conflict _Var1;
  long lVar2;
  string_view logging_function_00;
  string_view threadname;
  size_t sVar3;
  char *pcVar4;
  time_point tVar5;
  seconds sVar6;
  time_point now;
  seconds mocktime;
  FILE *__stream;
  BCLog *this_01;
  _List_node_base *p_Var7;
  long in_FS_OFFSET;
  __int_type_conflict _Var8;
  string_view sVar9;
  string_view str_00;
  allocator<char> local_112;
  allocator<char> local_111;
  string_view logging_function_local;
  BufferedLog buf;
  string str_prefixed;
  
  logging_function_local._M_str = logging_function._M_str;
  str_00._M_str = (char *)logging_function._M_len;
  str_00._M_len = str._M_str;
  this_01 = (BCLog *)str._M_len;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  logging_function_local._M_len = (size_t)str_00._M_str;
  LogEscapeMessage_abi_cxx11_(&str_prefixed,this_01,str_00);
  pcVar4 = logging_function_local._M_str;
  sVar3 = logging_function_local._M_len;
  sVar9 = source_file;
  _Var1 = (this->m_started_new_line)._M_base._M_i;
  if (this_01 == (BCLog *)0x0) {
    _Var8 = false;
  }
  else {
    _Var8 = (str_00._M_len + -1)[(long)this_01] == '\n';
  }
  LOCK();
  (this->m_started_new_line)._M_base._M_i = _Var8;
  UNLOCK();
  if (this->m_buffering == true) {
    if ((_Var1 & 1U) == 0) {
      if ((this->m_msgs_before_open).
          super__List_base<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>.
          _M_impl._M_node.super__List_node_base._M_next !=
          (_List_node_base *)&this->m_msgs_before_open) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((this->m_msgs_before_open).
                    super__List_base<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>
                    ._M_impl._M_node.super__List_node_base._M_prev + 2),&str_prefixed);
        this->m_cur_buffer_memusage = this->m_cur_buffer_memusage + str_prefixed._M_string_length;
        goto LAB_006227b7;
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                (&str_prefixed,0,"[...] ");
    }
    buf.now.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    buf.mocktime = GetMockTime();
    std::__cxx11::string::string((string *)&buf.str,&str_prefixed);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&buf.logging_function,&logging_function_local,&local_111);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&buf.source_file,&source_file,&local_112);
    util::ThreadGetInternalName_abi_cxx11_();
    buf.category = category;
    buf.level = level;
    this->m_cur_buffer_memusage =
         buf.str._M_string_length + buf.logging_function._M_string_length +
         buf.source_file._M_string_length + buf.threadname._M_string_length +
         this->m_cur_buffer_memusage + 0xd0;
    this_00 = &this->m_msgs_before_open;
    buf.source_line = source_line;
    std::__cxx11::list<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>::
    push_back(this_00,&buf);
    BufferedLog::~BufferedLog(&buf);
    while (this->m_max_buffer_memusage < this->m_cur_buffer_memusage) {
      p_Var7 = (this_00->
               super__List_base<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>
               )._M_impl._M_node.super__List_node_base._M_next;
      if (p_Var7 == (_List_node_base *)this_00) {
        this->m_cur_buffer_memusage = 0;
        break;
      }
      this->m_cur_buffer_memusage =
           (this->m_cur_buffer_memusage -
           ((long)&(p_Var7[6]._M_prev)->_M_next +
           (long)&(p_Var7[8]._M_prev)->_M_next +
           (long)&(p_Var7[4]._M_prev)->_M_next + (long)&(p_Var7[2]._M_prev)->_M_next)) - 0xd0;
      std::__cxx11::list<BCLog::Logger::BufferedLog,_std::allocator<BCLog::Logger::BufferedLog>_>::
      pop_front(this_00);
      this->m_buffer_lines_discarded = this->m_buffer_lines_discarded + 1;
    }
  }
  else {
    if ((_Var1 & 1U) != 0) {
      util::ThreadGetInternalName_abi_cxx11_();
      sVar6 = buf.mocktime;
      tVar5 = buf.now;
      now.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      mocktime = GetMockTime();
      logging_function_00._M_str = pcVar4;
      logging_function_00._M_len = sVar3;
      threadname._M_str = (char *)tVar5.__d.__r;
      threadname._M_len = sVar6.__r;
      FormatLogStrInPlace(this,&str_prefixed,category,level,sVar9,source_line,logging_function_00,
                          threadname,now,mocktime);
      std::__cxx11::string::~string((string *)&buf);
    }
    if (this->m_print_to_console == true) {
      fwrite(str_prefixed._M_dataplus._M_p,1,str_prefixed._M_string_length,_stdout);
      fflush(_stdout);
    }
    p_Var7 = (_List_node_base *)&this->m_print_callbacks;
    while (p_Var7 = (((_List_base<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
                       *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var7 != (_List_node_base *)&this->m_print_callbacks) {
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)(p_Var7 + 1),&str_prefixed);
    }
    if (this->m_print_to_file != false) {
      if (this->m_fileout == (FILE *)0x0) {
        __assert_fail("m_fileout != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/logging.cpp"
                      ,0x1c3,
                      "void BCLog::Logger::LogPrintStr_(std::string_view, std::string_view, std::string_view, int, BCLog::LogFlags, BCLog::Level)"
                     );
      }
      if (((this->m_reopen_file)._M_base._M_i & 1U) != 0) {
        LOCK();
        (this->m_reopen_file)._M_base._M_i = false;
        UNLOCK();
        __stream = fsbridge::fopen((char *)&this->m_file_path,"a");
        if (__stream != (FILE *)0x0) {
          setbuf(__stream,(char *)0x0);
          fclose((FILE *)this->m_fileout);
          this->m_fileout = (FILE *)__stream;
        }
      }
      sVar9._M_str = str_prefixed._M_dataplus._M_p;
      sVar9._M_len = str_prefixed._M_string_length;
      FileWriteStr(sVar9,this->m_fileout);
    }
  }
LAB_006227b7:
  std::__cxx11::string::~string((string *)&str_prefixed);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void BCLog::Logger::LogPrintStr_(std::string_view str, std::string_view logging_function, std::string_view source_file, int source_line, BCLog::LogFlags category, BCLog::Level level)
{
    std::string str_prefixed = LogEscapeMessage(str);

    const bool starts_new_line = m_started_new_line;
    m_started_new_line = !str.empty() && str[str.size()-1] == '\n';

    if (m_buffering) {
        if (!starts_new_line) {
            if (!m_msgs_before_open.empty()) {
                m_msgs_before_open.back().str += str_prefixed;
                m_cur_buffer_memusage += str_prefixed.size();
                return;
            } else {
                // unlikely edge case; add a marker that something was trimmed
                str_prefixed.insert(0, "[...] ");
            }
        }

        {
            BufferedLog buf{
                .now=SystemClock::now(),
                .mocktime=GetMockTime(),
                .str=str_prefixed,
                .logging_function=std::string(logging_function),
                .source_file=std::string(source_file),
                .threadname=util::ThreadGetInternalName(),
                .source_line=source_line,
                .category=category,
                .level=level,
            };
            m_cur_buffer_memusage += MemUsage(buf);
            m_msgs_before_open.push_back(std::move(buf));
        }

        while (m_cur_buffer_memusage > m_max_buffer_memusage) {
            if (m_msgs_before_open.empty()) {
                m_cur_buffer_memusage = 0;
                break;
            }
            m_cur_buffer_memusage -= MemUsage(m_msgs_before_open.front());
            m_msgs_before_open.pop_front();
            ++m_buffer_lines_discarded;
        }

        return;
    }

    if (starts_new_line) {
        FormatLogStrInPlace(str_prefixed, category, level, source_file, source_line, logging_function, util::ThreadGetInternalName(), SystemClock::now(), GetMockTime());
    }

    if (m_print_to_console) {
        // print to console
        fwrite(str_prefixed.data(), 1, str_prefixed.size(), stdout);
        fflush(stdout);
    }
    for (const auto& cb : m_print_callbacks) {
        cb(str_prefixed);
    }
    if (m_print_to_file) {
        assert(m_fileout != nullptr);

        // reopen the log file, if requested
        if (m_reopen_file) {
            m_reopen_file = false;
            FILE* new_fileout = fsbridge::fopen(m_file_path, "a");
            if (new_fileout) {
                setbuf(new_fileout, nullptr); // unbuffered
                fclose(m_fileout);
                m_fileout = new_fileout;
            }
        }
        FileWriteStr(str_prefixed, m_fileout);
    }
}